

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qimage.cpp
# Opt level: O3

void do_mirror_data<unsigned_char>
               (QImageData *dst,QImageData *src,int dstX0,int dstY0,int dstXIncr,int dstYIncr,int w,
               int h)

{
  uchar uVar1;
  uchar *puVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  uchar *puVar9;
  int srcXEnd2;
  int srcY;
  
  if (dst == src) {
    uVar4 = h;
    if (dstY0 != 0) {
      uVar4 = h / 2;
    }
    if (0 < (int)uVar4) {
      uVar3 = w / 2;
      if (dstY0 != 0) {
        uVar3 = w;
      }
      if (dstX0 == 0) {
        uVar3 = w;
      }
      lVar5 = (long)dstY0;
      uVar7 = 0;
      do {
        if (0 < (int)uVar3) {
          puVar9 = dst->data + dst->bytes_per_line * lVar5 + (long)dstX0;
          lVar6 = src->bytes_per_line * uVar7;
          puVar2 = src->data;
          uVar8 = 0;
          do {
            uVar1 = puVar2[uVar8 + lVar6];
            puVar2[uVar8 + lVar6] = *puVar9;
            *puVar9 = uVar1;
            uVar8 = uVar8 + 1;
            puVar9 = puVar9 + dstXIncr;
          } while (uVar3 != uVar8);
        }
        uVar7 = uVar7 + 1;
        lVar5 = lVar5 + dstYIncr;
      } while (uVar7 != uVar4);
    }
    if ((((dstY0 != 0) && (dstX0 != 0)) && ((h & 1U) != 0)) && (1 < w)) {
      lVar5 = (long)(h / 2) * src->bytes_per_line;
      puVar2 = src->data;
      lVar6 = (long)dstX0;
      uVar7 = 0;
      do {
        uVar1 = puVar2[uVar7 + lVar5];
        puVar2[uVar7 + lVar5] = puVar2[lVar6 + lVar5];
        puVar2[lVar6 + lVar5] = uVar1;
        uVar7 = uVar7 + 1;
        lVar6 = lVar6 + dstXIncr;
      } while ((uint)(w / 2) != uVar7);
    }
  }
  else if (0 < h) {
    lVar5 = (long)dstY0;
    uVar7 = 0;
    do {
      if (0 < w) {
        lVar6 = src->bytes_per_line;
        puVar2 = src->data;
        puVar9 = dst->data + dst->bytes_per_line * lVar5 + (long)dstX0;
        uVar8 = 0;
        do {
          *puVar9 = puVar2[uVar8 + lVar6 * uVar7];
          uVar8 = uVar8 + 1;
          puVar9 = puVar9 + dstXIncr;
        } while ((uint)w != uVar8);
      }
      uVar7 = uVar7 + 1;
      lVar5 = lVar5 + dstYIncr;
    } while (uVar7 != (uint)h);
  }
  return;
}

Assistant:

inline void do_mirror_data(QImageData *dst, QImageData *src,
                                             int dstX0, int dstY0,
                                             int dstXIncr, int dstYIncr,
                                             int w, int h)
{
    if (dst == src) {
        // When mirroring in-place, stop in the middle for one of the directions, since we
        // are swapping the bytes instead of merely copying.
        const int srcXEnd = (dstX0 && !dstY0) ? w / 2 : w;
        const int srcYEnd = dstY0 ? h / 2 : h;
        for (int srcY = 0, dstY = dstY0; srcY < srcYEnd; ++srcY, dstY += dstYIncr) {
            T *srcPtr = (T *) (src->data + srcY * src->bytes_per_line);
            T *dstPtr = (T *) (dst->data + dstY * dst->bytes_per_line);
            for (int srcX = 0, dstX = dstX0; srcX < srcXEnd; ++srcX, dstX += dstXIncr)
                std::swap(srcPtr[srcX], dstPtr[dstX]);
        }
        // If mirroring both ways, the middle line needs to be mirrored horizontally only.
        if (dstX0 && dstY0 && (h & 1)) {
            int srcY = h / 2;
            int srcXEnd2 = w / 2;
            T *srcPtr = (T *) (src->data + srcY * src->bytes_per_line);
            for (int srcX = 0, dstX = dstX0; srcX < srcXEnd2; ++srcX, dstX += dstXIncr)
                std::swap(srcPtr[srcX], srcPtr[dstX]);
        }
    } else {
        for (int srcY = 0, dstY = dstY0; srcY < h; ++srcY, dstY += dstYIncr) {
            T *srcPtr = (T *) (src->data + srcY * src->bytes_per_line);
            T *dstPtr = (T *) (dst->data + dstY * dst->bytes_per_line);
            for (int srcX = 0, dstX = dstX0; srcX < w; ++srcX, dstX += dstXIncr)
                dstPtr[dstX] = srcPtr[srcX];
        }
    }
}